

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_token_stream.c
# Opt level: O0

l2_token * l2_token_stream_next_token(l2_token_stream *token_stream_p)

{
  int cols_00;
  int iVar1;
  l2_token *plVar2;
  char *pcVar3;
  bool local_9d;
  char local_95 [3];
  char local_92;
  undefined1 local_91;
  undefined1 auStack_90 [3];
  char seq_5 [2];
  char seq_4 [3];
  int i_1;
  undefined1 local_84;
  char local_83;
  char local_82;
  char seq_3 [4];
  char seq_2 [2];
  char seq_1 [3];
  int i;
  char seq [4];
  char *keyword_p;
  int cols;
  int lines;
  l2_string token_str_buff;
  undefined4 uStack_48;
  char ch;
  int fa_state;
  l2_token t;
  l2_token_stream *token_stream_p_local;
  
  t._40_8_ = token_stream_p;
  l2_assert_func((long)token_stream_p,L2_INTERNAL_ERROR_NULL_POINTER,"l2_token_stream_next_token",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_token_stream.c"
                 ,0x35);
  if ((ulong)(long)*(int *)(t._40_8_ + 0x20) < *(ulong *)(t._40_8_ + 8)) {
    *(int *)(t._40_8_ + 0x20) = *(int *)(t._40_8_ + 0x20) + 1;
    plVar2 = (l2_token *)l2_vector_at((l2_vector *)t._40_8_,*(int *)(t._40_8_ + 0x20) + -1);
    return plVar2;
  }
  memset(&stack0xffffffffffffffb8,0,0x30);
  token_str_buff.max_len._4_4_ = 0;
  token_str_buff.max_len._3_1_ = '\0';
  l2_string_create((l2_string *)&cols);
LAB_00102e40:
  while( true ) {
    token_str_buff.max_len._3_1_ = l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
    iVar1 = *(int *)(*(long *)(t._40_8_ + 0x28) + 8);
    cols_00 = *(int *)(*(long *)(t._40_8_ + 0x28) + 0xc);
    if (token_str_buff.max_len._4_4_ != 0) break;
    t.u.str.max_len._0_4_ = *(undefined4 *)(*(long *)(t._40_8_ + 0x28) + 0x30);
    t.u.str.max_len._4_4_ = iVar1;
    t.current_pos_at_stream = cols_00;
    if ((((token_str_buff.max_len._3_1_ < 'A') || ('Z' < token_str_buff.max_len._3_1_)) &&
        ((token_str_buff.max_len._3_1_ < 'a' || ('z' < token_str_buff.max_len._3_1_)))) &&
       (token_str_buff.max_len._3_1_ != '_')) {
      if (token_str_buff.max_len._3_1_ == '0') {
        uStack_48 = 3;
        l2_string_push_char((l2_string *)&cols,'0');
        token_str_buff.max_len._4_4_ = 2;
      }
      else if ((token_str_buff.max_len._3_1_ < '1') || ('9' < token_str_buff.max_len._3_1_)) {
        if (token_str_buff.max_len._3_1_ == '\'') {
          uStack_48 = 3;
          token_str_buff.max_len._4_4_ = 4;
        }
        else if (token_str_buff.max_len._3_1_ == '\"') {
          uStack_48 = 5;
          token_str_buff.max_len._4_4_ = 5;
        }
        else {
          if (token_str_buff.max_len._3_1_ == '{') {
            uStack_48 = 6;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '}') {
            uStack_48 = 7;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '(') {
            uStack_48 = 8;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == ')') {
            uStack_48 = 9;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '[') {
            uStack_48 = 10;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == ']') {
            uStack_48 = 0xb;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '.') {
            uStack_48 = 0xc;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '!') {
            uStack_48 = 0xd;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x1e;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '~') {
            uStack_48 = 0xe;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '*') {
            uStack_48 = 0xf;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x29;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '/') {
            uStack_48 = 0x10;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x2a;
            }
            else if (token_str_buff.max_len._3_1_ == '/') {
              token_str_buff.max_len._3_1_ = '/';
              do {
                token_str_buff.max_len._3_1_ =
                     l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
                local_9d = token_str_buff.max_len._3_1_ != '\n' &&
                           token_str_buff.max_len._3_1_ != -1;
              } while (local_9d);
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '%') {
            uStack_48 = 0x11;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x2b;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '+') {
            uStack_48 = 0x12;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '+') {
              uStack_48 = 0x13;
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x27;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '-') {
            uStack_48 = 0x14;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '-') {
              uStack_48 = 0x15;
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x28;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '>') {
            uStack_48 = 0x19;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '>') {
              uStack_48 = 0x16;
              token_str_buff.max_len._3_1_ =
                   l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
              if (token_str_buff.max_len._3_1_ == '>') {
                uStack_48 = 0x17;
                token_str_buff.max_len._3_1_ =
                     l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
                if (token_str_buff.max_len._3_1_ == '=') {
                  uStack_48 = 0x2d;
                }
                else {
                  l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
                }
              }
              else if (token_str_buff.max_len._3_1_ == '=') {
                uStack_48 = 0x2c;
              }
              else {
                l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
              }
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x1a;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '<') {
            uStack_48 = 0x1b;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '<') {
              uStack_48 = 0x18;
              token_str_buff.max_len._3_1_ =
                   l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
              if (token_str_buff.max_len._3_1_ == '=') {
                uStack_48 = 0x2e;
              }
              else {
                l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
              }
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x1c;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '=') {
            uStack_48 = 0x26;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x1d;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '&') {
            uStack_48 = 0x1f;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '&') {
              uStack_48 = 0x22;
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x2f;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '^') {
            uStack_48 = 0x20;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x30;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '|') {
            uStack_48 = 0x21;
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if (token_str_buff.max_len._3_1_ == '|') {
              uStack_48 = 0x23;
            }
            else if (token_str_buff.max_len._3_1_ == '=') {
              uStack_48 = 0x31;
            }
            else {
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            }
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == '?') {
            uStack_48 = 0x24;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == ':') {
            uStack_48 = 0x25;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == ',') {
            uStack_48 = 0x32;
            goto LAB_001042d1;
          }
          if (token_str_buff.max_len._3_1_ == ';') {
            uStack_48 = 0x33;
            goto LAB_001042d1;
          }
          if ((((token_str_buff.max_len._3_1_ != ' ') && (token_str_buff.max_len._3_1_ != '\t')) &&
              (token_str_buff.max_len._3_1_ != '\n')) && (token_str_buff.max_len._3_1_ != '\r')) {
            if (token_str_buff.max_len._3_1_ != -1) {
              l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_CHARACTER,iVar1,cols_00,
                               (ulong)(uint)(int)token_str_buff.max_len._3_1_);
            }
            uStack_48 = 0;
LAB_001042d1:
            l2_string_destroy((l2_string *)&cols);
            l2_vector_append((l2_vector *)t._40_8_,&stack0xffffffffffffffb8);
            *(int *)(t._40_8_ + 0x20) = *(int *)(t._40_8_ + 0x20) + 1;
            plVar2 = (l2_token *)l2_vector_tail((l2_vector *)t._40_8_);
            return plVar2;
          }
        }
      }
      else {
        uStack_48 = 3;
        l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
        token_str_buff.max_len._4_4_ = 3;
      }
    }
    else {
      uStack_48 = 2;
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      token_str_buff.max_len._4_4_ = 1;
    }
  }
  if (token_str_buff.max_len._4_4_ == 1) {
    if ((((token_str_buff.max_len._3_1_ < 'A') || ('Z' < token_str_buff.max_len._3_1_)) &&
        ((token_str_buff.max_len._3_1_ < 'a' || ('z' < token_str_buff.max_len._3_1_)))) &&
       ((token_str_buff.max_len._3_1_ != '_' &&
        ((token_str_buff.max_len._3_1_ < '0' || ('9' < token_str_buff.max_len._3_1_)))))) {
      l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
      pcVar3 = l2_token_stream_str_keyword((l2_string *)&cols);
      if (pcVar3 == (char *)0x0) {
        uStack_48 = 2;
        l2_string_create((l2_string *)&t);
        l2_string_strcpy((l2_string *)&t,(l2_string *)&cols);
      }
      else {
        uStack_48 = 1;
        t._0_8_ = pcVar3;
      }
      goto LAB_001042d1;
    }
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 2) {
    if ((token_str_buff.max_len._3_1_ == 'X') || (token_str_buff.max_len._3_1_ == 'x')) {
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      token_str_buff.max_len._4_4_ = 0x20;
    }
    else if ((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) {
      if (token_str_buff.max_len._3_1_ != '.') {
        t._0_8_ = t._0_8_ & 0xffffffff00000000;
        l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
        goto LAB_001042d1;
      }
      uStack_48 = 4;
      l2_string_push_char((l2_string *)&cols,'.');
      token_str_buff.max_len._4_4_ = 0x31;
    }
    else {
      if ('7' < token_str_buff.max_len._3_1_) {
        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL,iVar1,cols_00,
                         (ulong)(uint)(int)token_str_buff.max_len._3_1_);
      }
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      token_str_buff.max_len._4_4_ = 0x21;
    }
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 3) {
    if ((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) {
      if (token_str_buff.max_len._3_1_ != '.') {
        pcVar3 = l2_string_get_str_p((l2_string *)&cols);
        t.type = l2_cast_decimal_str_to_int(pcVar3);
        l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
        goto LAB_001042d1;
      }
      uStack_48 = 4;
      l2_string_push_char((l2_string *)&cols,'.');
      token_str_buff.max_len._4_4_ = 0x31;
    }
    else {
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    }
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 4) {
    if (token_str_buff.max_len._3_1_ == '\'') {
      l2_parsing_error(L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL,iVar1,cols_00);
    }
    if (token_str_buff.max_len._3_1_ == '\\') {
      token_str_buff.max_len._4_4_ = 0x40;
    }
    else {
      if (token_str_buff.max_len._3_1_ == -1) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL,iVar1,cols_00);
      }
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      token_str_buff.max_len._4_4_ = 0x400;
    }
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 5) {
    if (token_str_buff.max_len._3_1_ == '\"') {
      l2_string_push_char((l2_string *)&cols,'\0');
      goto LAB_001042d1;
    }
    if (token_str_buff.max_len._3_1_ == '\\') {
      token_str_buff.max_len._4_4_ = 0x50;
    }
    else {
      if (token_str_buff.max_len._3_1_ == -1) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL,iVar1,cols_00);
      }
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      token_str_buff.max_len._4_4_ = 0x500;
    }
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 0x20) {
    if ((((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) &&
        ((token_str_buff.max_len._3_1_ < 'a' || ('f' < token_str_buff.max_len._3_1_)))) &&
       ((token_str_buff.max_len._3_1_ < 'A' || ('F' < token_str_buff.max_len._3_1_)))) {
      l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL,iVar1,cols_00);
    }
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    token_str_buff.max_len._4_4_ = 0x200;
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 0x21) {
    if ((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) {
      pcVar3 = l2_string_get_str_p((l2_string *)&cols);
      t.type = l2_cast_octal_str_to_int(pcVar3 + 1);
      l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
      goto LAB_001042d1;
    }
    if ('7' < token_str_buff.max_len._3_1_) {
      l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL,iVar1,cols_00,
                       (ulong)(uint)(int)token_str_buff.max_len._3_1_);
    }
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 0x31) {
    if ((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) {
      l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL,iVar1,cols_00);
    }
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    token_str_buff.max_len._4_4_ = 0x32;
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ == 0x32) {
    if ((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) {
      pcVar3 = l2_string_get_str_p((l2_string *)&cols);
      t._0_8_ = l2_cast_real_str_to_int(pcVar3);
      l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
      goto LAB_001042d1;
    }
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    token_str_buff.max_len._4_4_ = 0x32;
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._4_4_ != 0x40) {
    if (token_str_buff.max_len._4_4_ == 0x50) {
      if (token_str_buff.max_len._3_1_ == 'a') {
        l2_string_push_char((l2_string *)&cols,'\a');
      }
      else if (token_str_buff.max_len._3_1_ == 'b') {
        l2_string_push_char((l2_string *)&cols,'\b');
      }
      else if (token_str_buff.max_len._3_1_ == 'f') {
        l2_string_push_char((l2_string *)&cols,'\f');
      }
      else if (token_str_buff.max_len._3_1_ == 'n') {
        l2_string_push_char((l2_string *)&cols,'\n');
      }
      else if (token_str_buff.max_len._3_1_ == 'r') {
        l2_string_push_char((l2_string *)&cols,'\r');
      }
      else if (token_str_buff.max_len._3_1_ == 't') {
        l2_string_push_char((l2_string *)&cols,'\t');
      }
      else if (token_str_buff.max_len._3_1_ == 'v') {
        l2_string_push_char((l2_string *)&cols,'\v');
      }
      else if (token_str_buff.max_len._3_1_ == '\\') {
        l2_string_push_char((l2_string *)&cols,'\\');
      }
      else if (token_str_buff.max_len._3_1_ == '\'') {
        l2_string_push_char((l2_string *)&cols,'\'');
      }
      else if (token_str_buff.max_len._3_1_ == '\"') {
        l2_string_push_char((l2_string *)&cols,'\"');
      }
      else if (token_str_buff.max_len._3_1_ == '?') {
        l2_string_push_char((l2_string *)&cols,'?');
      }
      else {
        if (('/' < token_str_buff.max_len._3_1_) && (token_str_buff.max_len._3_1_ < '8')) {
          for (_auStack_90 = 1; _auStack_90 < 3; _auStack_90 = _auStack_90 + 1) {
            token_str_buff.max_len._3_1_ =
                 l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
            if ((token_str_buff.max_len._3_1_ < '0') || ('7' < token_str_buff.max_len._3_1_)) {
              seq_4[(long)_auStack_90 + 2] = '\0';
              l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
              break;
            }
            seq_4[(long)_auStack_90 + 2] = token_str_buff.max_len._3_1_;
          }
          seq_4[(long)_auStack_90 + 2] = '\0';
          iVar1 = l2_cast_octal_str_to_int(seq_4 + 2);
          l2_string_push_char((l2_string *)&cols,(char)iVar1);
          token_str_buff.max_len._4_4_ = 0x500;
          goto LAB_00102e40;
        }
        if (token_str_buff.max_len._3_1_ == 'x') {
          local_95[2] = l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
          local_92 = 0;
          token_str_buff.max_len._3_1_ = local_95[2];
          if ((((local_95[2] < '0') || ('9' < local_95[2])) &&
              ((local_95[2] < 'a' || ('f' < local_95[2])))) &&
             ((local_95[2] < 'A' || ('F' < local_95[2])))) {
            l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar1,cols_00,local_95 + 2
                              );
            l2_string_push_char((l2_string *)&cols,local_95[2]);
          }
          token_str_buff.max_len._3_1_ =
               l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
          if ((((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) &&
              ((token_str_buff.max_len._3_1_ < 'a' || ('f' < token_str_buff.max_len._3_1_)))) &&
             ((token_str_buff.max_len._3_1_ < 'A' || ('F' < token_str_buff.max_len._3_1_)))) {
            local_92 = '\0';
            l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
            iVar1 = l2_cast_hex_str_to_int(local_95 + 2);
            l2_string_push_char((l2_string *)&cols,(char)iVar1);
            token_str_buff.max_len._4_4_ = 0x500;
          }
          else {
            local_91 = 0;
            local_92 = token_str_buff.max_len._3_1_;
            iVar1 = l2_cast_hex_str_to_int(local_95 + 2);
            l2_string_push_char((l2_string *)&cols,(char)iVar1);
            token_str_buff.max_len._4_4_ = 0x500;
          }
          goto LAB_00102e40;
        }
        if (token_str_buff.max_len._3_1_ == -1) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL,iVar1,cols_00);
        }
        local_95[1] = 0;
        local_95[0] = token_str_buff.max_len._3_1_;
        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar1,cols_00,local_95);
        l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
      }
      token_str_buff.max_len._4_4_ = 0x500;
      goto LAB_00102e40;
    }
    if (token_str_buff.max_len._4_4_ == 0x200) {
      if ((((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) &&
          ((token_str_buff.max_len._3_1_ < 'a' || ('f' < token_str_buff.max_len._3_1_)))) &&
         ((token_str_buff.max_len._3_1_ < 'A' || ('F' < token_str_buff.max_len._3_1_)))) {
        pcVar3 = l2_string_get_str_p((l2_string *)&cols);
        t.type = l2_cast_hex_str_to_int(pcVar3 + 2);
        l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
        goto LAB_001042d1;
      }
      l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
    }
    else {
      if (token_str_buff.max_len._4_4_ == 0x400) {
        if (token_str_buff.max_len._3_1_ != '\'') {
          if (token_str_buff.max_len._3_1_ != -1) {
            l2_parsing_error(L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL,iVar1,
                             cols_00);
          }
          l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL,iVar1,cols_00);
        }
        pcVar3 = l2_string_get_str_p((l2_string *)&cols);
        t.type = (int)*pcVar3;
        goto LAB_001042d1;
      }
      if (token_str_buff.max_len._4_4_ == 0x500) {
        if (token_str_buff.max_len._3_1_ == '\"') {
          l2_string_create((l2_string *)&t);
          l2_string_strcpy((l2_string *)&t,(l2_string *)&cols);
          goto LAB_001042d1;
        }
        if (token_str_buff.max_len._3_1_ == '\\') {
          token_str_buff.max_len._4_4_ = 0x50;
        }
        else {
          if (token_str_buff.max_len._3_1_ == -1) {
            l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL,iVar1,cols_00);
          }
          l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
        }
      }
    }
    goto LAB_00102e40;
  }
  if (token_str_buff.max_len._3_1_ == 'a') {
    l2_string_push_char((l2_string *)&cols,'\a');
  }
  else if (token_str_buff.max_len._3_1_ == 'b') {
    l2_string_push_char((l2_string *)&cols,'\b');
  }
  else if (token_str_buff.max_len._3_1_ == 'f') {
    l2_string_push_char((l2_string *)&cols,'\f');
  }
  else if (token_str_buff.max_len._3_1_ == 'n') {
    l2_string_push_char((l2_string *)&cols,'\n');
  }
  else if (token_str_buff.max_len._3_1_ == 'r') {
    l2_string_push_char((l2_string *)&cols,'\r');
  }
  else if (token_str_buff.max_len._3_1_ == 't') {
    l2_string_push_char((l2_string *)&cols,'\t');
  }
  else if (token_str_buff.max_len._3_1_ == 'v') {
    l2_string_push_char((l2_string *)&cols,'\v');
  }
  else if (token_str_buff.max_len._3_1_ == '\\') {
    l2_string_push_char((l2_string *)&cols,'\\');
  }
  else if (token_str_buff.max_len._3_1_ == '\'') {
    l2_string_push_char((l2_string *)&cols,'\'');
  }
  else if (token_str_buff.max_len._3_1_ == '\"') {
    l2_string_push_char((l2_string *)&cols,'\"');
  }
  else if (token_str_buff.max_len._3_1_ == '?') {
    l2_string_push_char((l2_string *)&cols,'?');
  }
  else {
    if (('/' < token_str_buff.max_len._3_1_) && (token_str_buff.max_len._3_1_ < '8')) {
      for (stack0xffffffffffffff80 = 1; stack0xffffffffffffff80 < 3;
          register0x00000000 = stack0xffffffffffffff80 + 1) {
        token_str_buff.max_len._3_1_ =
             l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
        if ((token_str_buff.max_len._3_1_ < '0') || ('7' < token_str_buff.max_len._3_1_)) {
          seq_2[(long)stack0xffffffffffffff80 + 1] = '\0';
          l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
          break;
        }
        seq_2[(long)stack0xffffffffffffff80 + 1] = token_str_buff.max_len._3_1_;
      }
      seq_2[(long)stack0xffffffffffffff80 + 1] = '\0';
      iVar1 = l2_cast_octal_str_to_int(seq_2 + 1);
      l2_string_push_char((l2_string *)&cols,(char)iVar1);
      token_str_buff.max_len._4_4_ = 0x400;
      goto LAB_00102e40;
    }
    if (token_str_buff.max_len._3_1_ == 'x') {
      local_83 = l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28));
      local_82 = 0;
      token_str_buff.max_len._3_1_ = local_83;
      if ((((local_83 < '0') || ('9' < local_83)) && ((local_83 < 'a' || ('f' < local_83)))) &&
         ((local_83 < 'A' || ('F' < local_83)))) {
        l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar1,cols_00,&local_83);
        l2_string_push_char((l2_string *)&cols,local_83);
      }
      token_str_buff.max_len._3_1_ = l2_char_stream_next_char(*(l2_char_stream **)(t._40_8_ + 0x28))
      ;
      if ((((token_str_buff.max_len._3_1_ < '0') || ('9' < token_str_buff.max_len._3_1_)) &&
          ((token_str_buff.max_len._3_1_ < 'a' || ('f' < token_str_buff.max_len._3_1_)))) &&
         ((token_str_buff.max_len._3_1_ < 'A' || ('F' < token_str_buff.max_len._3_1_)))) {
        local_82 = '\0';
        l2_char_stream_rollback(*(l2_char_stream **)(t._40_8_ + 0x28));
      }
      else {
        seq_3[0] = '\0';
        local_82 = token_str_buff.max_len._3_1_;
        iVar1 = l2_cast_hex_str_to_int(&local_83);
        l2_string_push_char((l2_string *)&cols,(char)iVar1);
        token_str_buff.max_len._4_4_ = 0x400;
      }
      goto LAB_00102e40;
    }
    if (token_str_buff.max_len._3_1_ == -1) {
      l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL,iVar1,cols_00);
    }
    local_84 = 0;
    i_1._3_1_ = token_str_buff.max_len._3_1_;
    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar1,cols_00,(long)&i_1 + 3);
    l2_string_push_char((l2_string *)&cols,token_str_buff.max_len._3_1_);
  }
  token_str_buff.max_len._4_4_ = 0x400;
  goto LAB_00102e40;
}

Assistant:

l2_token *l2_token_stream_next_token(l2_token_stream *token_stream_p) {
    l2_assert(token_stream_p, L2_INTERNAL_ERROR_NULL_POINTER);

    if (token_stream_p->token_vector_current_pos < token_stream_p->token_vector.size) {
        token_stream_p->token_vector_current_pos += 1;
        return (l2_token *)l2_vector_at(&token_stream_p->token_vector, token_stream_p->token_vector_current_pos - 1);
    }


    l2_token t = { 0 };
    int fa_state = 0x0;
    char ch = 0;
    l2_string token_str_buff;
    l2_string_create(&token_str_buff);

    while(1) {
        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);

        int lines = token_stream_p->char_stream_p->lines;
        int cols = token_stream_p->char_stream_p->cols;

        switch (fa_state) {
            case 0x0:
                t.current_col = cols;
                t.current_line = lines;
                t.current_pos_at_stream = token_stream_p->char_stream_p->chars_vector_current_pos;

                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_') {
                    t.type = L2_TOKEN_IDENTIFIER;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x1;

                } else if (ch == '0') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x2;

                } else if (ch >= '1' && ch <= '9') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x3;

                } else if (ch == '\'') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    fa_state = 0x4;

                } else if (ch == '\"') {
                    t.type = L2_TOKEN_STRING_LITERAL;
                    fa_state = 0x5;

                } else if (ch == '{') {
                    t.type = L2_TOKEN_LBRACE;
                    goto ret;

                } else if (ch == '}') {
                    t.type = L2_TOKEN_RBRACE;
                    goto ret;

                } else if (ch == '(') {
                    t.type = L2_TOKEN_LP;
                    goto ret;

                } else if (ch == ')') {
                    t.type = L2_TOKEN_RP;
                    goto ret;

                } else if (ch == '[') {
                    t.type = L2_TOKEN_LBRACKET;
                    goto ret;

                } else if (ch == ']') {
                    t.type = L2_TOKEN_RBRACKET;
                    goto ret;

                } else if (ch == '.') {
                    t.type = L2_TOKEN_DOT;
                    goto ret;

                } else if (ch == '!') {
                    t.type = L2_TOKEN_LOGIC_NOT;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_NOT_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '~') {
                    t.type = L2_TOKEN_BIT_NOT;
                    goto ret;

                } else if (ch == '*') {
                    t.type = L2_TOKEN_MUL;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MUL_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '/') {
                    t.type = L2_TOKEN_DIV;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_DIV_ASSIGN;
                    } else if (ch == '/') {
						do {
							ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
						} while (ch != '\n' && ch != EOF);
		    		} else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '%') {
                    t.type = L2_TOKEN_MOD;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MOD_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '+') {
                    t.type = L2_TOKEN_PLUS;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '+') {
                        t.type = L2_TOKEN_INC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_PLUS_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '-') {
                    t.type = L2_TOKEN_SUB;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '-') {
                        t.type = L2_TOKEN_DEC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_SUB_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '>') {
                    t.type = L2_TOKEN_GREAT_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '>') {
                        t.type = L2_TOKEN_RSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '>') {
                            t.type = L2_TOKEN_RSHIFT_UNSIGNED;
                            ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                            if (ch == '=') {
                                t.type = L2_TOKEN_RSHIFT_UNSIGNED_ASSIGN;
                            } else {
                                l2_char_stream_rollback(token_stream_p->char_stream_p);
                            }
                        } else if (ch == '=') {
                            t.type = L2_TOKEN_RSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_GREAT_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '<') {
                    t.type = L2_TOKEN_LESS_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '<') {
                        t.type = L2_TOKEN_LSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '=') {
                            t.type = L2_TOKEN_LSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_LESS_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '=') {
                    t.type = L2_TOKEN_ASSIGN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '&') {
                    t.type = L2_TOKEN_BIT_AND;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '&') {
                        t.type = L2_TOKEN_LOGIC_AND;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_AND_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '^') {
                    t.type = L2_TOKEN_BIT_XOR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_BIT_XOR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '|') {
                    t.type = L2_TOKEN_BIT_OR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '|') {
                        t.type = L2_TOKEN_LOGIC_OR;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_OR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '?') {
                    t.type = L2_TOKEN_QM;
                    goto ret;

                } else if (ch == ':') {
                    t.type = L2_TOKEN_COLON;
                    goto ret;

                } else if (ch == ',') {
                    t.type = L2_TOKEN_COMMA;
                    goto ret;

                } else if (ch == ';') {
                    t.type = L2_TOKEN_SEMICOLON;
                    goto ret;

                } else if (l2_char_is_blank(ch)) {

                } else if (ch == L2_EOF) {
                    t.type = L2_TOKEN_TERMINATOR;
                    goto ret;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_CHARACTER, lines, cols, ch);

                }

                break;

            case 0x1: /* handle identifier or keyword */
                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_' || (ch >= '0' && ch <= '9')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    char *keyword_p = l2_token_stream_str_keyword(&token_str_buff);
                    if (keyword_p) {
                        t.type = L2_TOKEN_KEYWORD;
                        //l2_string_destroy(&token_str_buff);
                        t.u.c_str = keyword_p;
                    } else {
                        t.type = L2_TOKEN_IDENTIFIER;
                        l2_string_create(&t.u.str);
                        l2_string_strcpy(&t.u.str, &token_str_buff);
                    }
                    goto ret;

                }
                break;

            case 0x2: /* handle oct and hex number literal ( begin with 0 ) */
                if (ch == 'X' || ch == 'x') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x20;

                } else if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x21;

				} else if (ch == '.') {
					t.type = L2_TOKEN_REAL_LITERAL;
					l2_string_push_char(&token_str_buff, ch);
					fa_state = 0x31;

				} else { /* get 0 */
                    t.u.integer = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x20: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x200;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL, lines, cols);

                }
                break;

            case 0x200: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_hex_str_to_int(&(l2_string_get_str_p(&token_str_buff)[2]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x21: /* handle oct number literal */
                if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_octal_str_to_int(&(l2_string_get_str_p(&token_str_buff)[1]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x3: /* handle dec number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);

                } else if (ch == '.') {
                    t.type = L2_TOKEN_REAL_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x31;

                } else {
                    t.u.integer = l2_cast_decimal_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x31: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL, lines, cols);
                }
                break;

            case 0x32: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    t.u.real = l2_cast_real_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x4: /* handle character literal */
                if (ch == '\'') {
                    l2_parsing_error(L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL, lines, cols);

                } else if (ch == '\\') {
                    fa_state = 0x40;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x400;

                }
                break;

            case 0x40: /* handle escape character */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x400;

                break;

            case 0x400:
                if (ch == '\'') {
                    t.u.integer = l2_string_get_str_p(&token_str_buff)[0];
                    goto ret;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL, lines, cols);

                }
                break;

            case 0x5: /* handle string literal */
                if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\0');
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x500;
                }
                break;

            case 0x50: /* handle escape character in string literal */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                        fa_state = 0x500;
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x500;
                break;

            case 0x500:
                if (ch == '\"') {
                    l2_string_create(&t.u.str);
                    l2_string_strcpy(&t.u.str, &token_str_buff);
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                }
                break;
        }


    }

    ret:

    l2_string_destroy(&token_str_buff);

    l2_vector_append(&token_stream_p->token_vector, &t);
    token_stream_p->token_vector_current_pos += 1;
    return (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
}